

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O0

void WjTestLib_AddTest(WJTL_UNIT_TEST_FUNCTION TestFunction,char *TestName)

{
  WjtlTestList *pWVar1;
  char *pcVar2;
  WjtlTestList *newTest;
  char *TestName_local;
  WJTL_UNIT_TEST_FUNCTION TestFunction_local;
  
  if ((TestFunction == (WJTL_UNIT_TEST_FUNCTION)0x0) || (TestName == (char *)0x0)) {
    InternalError("Invalid parameters");
  }
  else {
    if (gGroupListTail == (WjtlGroupList *)0x0) {
      WjTestLib_NewGroup("Default");
    }
    if (gGroupListTail == (WjtlGroupList *)0x0) {
      InternalError("Failed to create default group");
    }
    else {
      pWVar1 = (WjtlTestList *)calloc(1,0x50);
      if (pWVar1 == (WjtlTestList *)0x0) {
        InternalError("Memory fail");
      }
      else {
        pcVar2 = strdup(TestName);
        pWVar1->TestName = pcVar2;
        if (pWVar1->TestName == (char *)0x0) {
          InternalError("Memory fail");
        }
        else {
          pWVar1->NumAllocations = 0;
          pWVar1->NumDeallocations = 0;
          pWVar1->NumAsserts = 0;
          pWVar1->NumFailedAsserts = 0;
          pWVar1->TestFunction = TestFunction;
          pWVar1->Next = (WjtlTestList *)0x0;
          if (gGroupListTail->TestListTail == (WjtlTestList *)0x0) {
            gGroupListTail->TestListHead = pWVar1;
          }
          else {
            gGroupListTail->TestListTail->Next = pWVar1;
          }
          gGroupListTail->TestListTail = pWVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void
    WjTestLib_AddTest
    (
        WJTL_UNIT_TEST_FUNCTION     TestFunction,
        char const*                 TestName
    )
{
    if(     NULL != TestFunction
        &&  NULL != TestName )
    {
        if( NULL == gGroupListTail )
        {
            // No group created yet, so make a default one
            WjTestLib_NewGroup( "Default" );
        }

        if( NULL != gGroupListTail )
        {
            WjtlTestList* newTest = calloc( 1, sizeof(WjtlTestList) );
            if( NULL != newTest )
            {
                newTest->TestName = strdup( TestName );
                if( NULL != newTest->TestName )
                {
                    newTest->NumAllocations = 0;
                    newTest->NumDeallocations = 0;
                    newTest->NumAsserts = 0;
                    newTest->NumFailedAsserts = 0;
                    newTest->TestFunction = TestFunction;
                    newTest->Next = NULL;

                    if( NULL == gGroupListTail->TestListTail )
                    {
                        gGroupListTail->TestListHead = newTest;
                    }
                    else
                    {
                        gGroupListTail->TestListTail->Next = newTest;
                    }
                    gGroupListTail->TestListTail = newTest;
                }
                else
                {
                    InternalError( "Memory fail" );
                }
            }
            else
            {
                InternalError( "Memory fail" );
            }
        }
        else
        {
            InternalError( "Failed to create default group" );
        }
    }
    else
    {
        InternalError( "Invalid parameters" );
    }
}